

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main_impl.h
# Opt level: O1

int secp256k1_keypair_load
              (secp256k1_context *ctx,secp256k1_scalar *sk,secp256k1_ge *pk,
              secp256k1_keypair *keypair)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  uint uVar6;
  long lVar7;
  secp256k1_ge *psVar8;
  byte bVar9;
  int overflow;
  int local_2c;
  
  bVar9 = 0;
  uVar6 = secp256k1_pubkey_load(ctx,pk,(secp256k1_pubkey *)(keypair->data + 0x20));
  if (sk != (secp256k1_scalar *)0x0) {
    if (uVar6 == 0) {
      uVar6 = 0;
    }
    else {
      secp256k1_scalar_set_b32(sk,keypair->data,&local_2c);
      bVar4 = sk->d[1] == 0;
      bVar5 = sk->d[0] == 0;
      bVar3 = sk->d[2] == 0;
      bVar1 = sk->d[3] != 0;
      bVar2 = !bVar1;
      if (((bVar4 && bVar5) && bVar3) && bVar2 || local_2c != 0) {
        secp256k1_keypair_load_cold_1();
      }
      uVar6 = (uint)(local_2c == 0 && (((!bVar4 || !bVar5) || !bVar3) || !bVar2 && bVar1));
    }
  }
  if (uVar6 == 0) {
    psVar8 = &secp256k1_ge_const_g;
    for (lVar7 = 0xb; lVar7 != 0; lVar7 = lVar7 + -1) {
      (pk->x).n[0] = (psVar8->x).n[0];
      psVar8 = (secp256k1_ge *)((long)psVar8 + ((ulong)bVar9 * -2 + 1) * 8);
      pk = (secp256k1_ge *)((long)pk + (ulong)bVar9 * -0x10 + 8);
    }
    if (sk != (secp256k1_scalar *)0x0) {
      sk->d[2] = 0;
      sk->d[3] = 0;
      sk->d[0] = 1;
      sk->d[1] = 0;
    }
  }
  return uVar6;
}

Assistant:

static int secp256k1_keypair_load(const secp256k1_context* ctx, secp256k1_scalar *sk, secp256k1_ge *pk, const secp256k1_keypair *keypair) {
    int ret;
    const secp256k1_pubkey *pubkey = (const secp256k1_pubkey *)&keypair->data[32];

    /* Need to declassify the pubkey because pubkey_load ARG_CHECKs if it's
     * invalid. */
    secp256k1_declassify(ctx, pubkey, sizeof(*pubkey));
    ret = secp256k1_pubkey_load(ctx, pk, pubkey);
    if (sk != NULL) {
        ret = ret && secp256k1_keypair_seckey_load(ctx, sk, keypair);
    }
    if (!ret) {
        *pk = secp256k1_ge_const_g;
        if (sk != NULL) {
            *sk = secp256k1_scalar_one;
        }
    }
    return ret;
}